

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

unsigned_long *
StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2]>
          (unsigned_long *arg,char (*args) [2],char *args_1,char (*args_2) [2])

{
  char *in_RCX;
  char (*in_RDX) [2];
  unsigned_long *in_RDI;
  char (*in_R8) [2];
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  StringBuilder<unsigned_long>(in_RDI);
  StringBuilder<char[2],char&,char_const(&)[2]>(in_RDX,in_RCX,in_R8);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}